

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
* __thiscall
slang::
SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
::operator=(SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
            *this,SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                  *rhs)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  
  if (this == rhs) {
    return this;
  }
  uVar1 = this->len;
  uVar2 = rhs->len;
  if (uVar1 < uVar2) {
    if (this->cap < uVar2) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar1 != 0) {
      std::ranges::
      __copy_or_move<false,_const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*>
                (rhs->data_,rhs->data_ + uVar1,this->data_);
    }
    std::ranges::__uninitialized_copy_fn::
    operator()<const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*>
              ((__uninitialized_copy_fn *)&std::ranges::uninitialized_copy,rhs->data_ + this->len,
               rhs->data_ + rhs->len,this->data_ + this->len,this->data_ + rhs->len);
  }
  else {
    if (uVar2 == 0) {
      sVar3 = 0;
      goto LAB_00723d12;
    }
    std::ranges::__copy_fn::
    operator()<const_slang::SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>_&,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*>
              ((__copy_fn *)&std::ranges::copy,rhs,this->data_);
  }
  sVar3 = rhs->len;
LAB_00723d12:
  this->len = sVar3;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(const SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return *this;

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::copy(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::copy(rhs.begin(), rhs.begin() + len, begin());
    }

    // Copy construct the new elements in place.
    std::ranges::uninitialized_copy(rhs.begin() + len, rhs.end(), begin() + len,
                                    begin() + rhs.size());
    len = rhs.size();
    return *this;
}